

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void crypto_stream_receive(quicly_stream_t *stream,size_t off,void *src,size_t len)

{
  st_quicly_application_space_t *psVar1;
  int iVar2;
  long *in_RDI;
  ptls_iovec_t pVar3;
  int ret;
  int handshake_result;
  ptls_buffer_t output;
  ptls_iovec_t input;
  size_t epoch_offsets [5];
  size_t in_epoch;
  quicly_conn_t *conn;
  void *in_stack_ffffffffffffff18;
  ptls_handshake_properties_t *delta;
  quicly_stream_t *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  uint uVar4;
  quicly_stream_t *in_stack_ffffffffffffff30;
  uint in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  ptls_buffer_t *in_stack_ffffffffffffff40;
  quicly_conn_t *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  undefined1 local_58 [40];
  long local_30;
  quicly_conn_t *local_28;
  
  local_28 = (quicly_conn_t *)*in_RDI;
  local_30 = -(in_RDI[1] + 1);
  memset(local_58,0,0x28);
  iVar2 = quicly_streambuf_ingress_receive
                    (in_stack_ffffffffffffff30,
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     in_stack_ffffffffffffff20,(size_t)in_stack_ffffffffffffff18);
  if (iVar2 == 0) {
    ptls_buffer_init((ptls_buffer_t *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,0x141e9f);
    while( true ) {
      pVar3 = quicly_streambuf_ingress_get(in_stack_ffffffffffffff20);
      if ((ptls_handshake_properties_t *)pVar3.len == (ptls_handshake_properties_t *)0x0) break;
      delta = &(local_28->crypto).handshake_properties;
      in_stack_ffffffffffffff38 =
           ptls_handle_message((ptls_t *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               (ptls_buffer_t *)in_stack_ffffffffffffff48,
                               (size_t *)in_stack_ffffffffffffff40,
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                               in_stack_ffffffffffffff30,
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                               (ptls_handshake_properties_t *)pVar3.len);
      quicly_streambuf_ingress_shift(in_stack_ffffffffffffff20,(size_t)delta);
      if ((in_stack_ffffffffffffff38 != 0) && (in_stack_ffffffffffffff38 != 0x202)) {
        uVar4 = in_stack_ffffffffffffff38;
        if ((in_stack_ffffffffffffff38 & 0xffffff00) != 0) {
          uVar4 = 0x20001;
        }
        initiate_close((quicly_conn_t *)
                       CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                       (int)((ulong)local_28 >> 0x20),CONCAT44(uVar4,in_stack_ffffffffffffff28),
                       (char *)in_stack_ffffffffffffff20);
        goto LAB_00142104;
      }
      in_stack_ffffffffffffff54 = in_stack_ffffffffffffff38;
      if (((local_28->application != (st_quicly_application_space_t *)0x0) &&
          (local_28->application->one_rtt_writable == 0)) &&
         ((local_28->application->cipher).egress.key.aead != (ptls_aead_context_t *)0x0)) {
        iVar2 = quicly_is_client(local_28);
        if (iVar2 == 0) {
          __assert_fail("quicly_is_client(conn)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x3d6,
                        "void crypto_stream_receive(quicly_stream_t *, size_t, const void *, size_t)"
                       );
        }
        if ((local_28->crypto).handshake_properties.field_0.client.early_data_acceptance ==
            PTLS_EARLY_DATA_REJECTED) {
          dispose_cipher((st_quicly_cipher_context_t *)0x142071);
          psVar1 = local_28->application;
          in_stack_ffffffffffffff40 = (ptls_buffer_t *)0x0;
          in_stack_ffffffffffffff48 = (quicly_conn_t *)0x0;
          (psVar1->cipher).egress.key.aead = (ptls_aead_context_t *)0x0;
          (psVar1->cipher).egress.key.header_protection = (ptls_cipher_context_t *)0x0;
          iVar2 = discard_sentmap_by_epoch((quicly_conn_t *)0x0,0);
          if (iVar2 != 0) {
            initiate_close((quicly_conn_t *)CONCAT44(iVar2,in_stack_ffffffffffffff38),
                           (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                           CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                           (char *)in_stack_ffffffffffffff20);
            goto LAB_00142104;
          }
          in_stack_ffffffffffffff3c = 0;
        }
      }
    }
    write_crypto_data(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                      (size_t *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
LAB_00142104:
    ptls_buffer_dispose(in_stack_ffffffffffffff40);
  }
  return;
}

Assistant:

void crypto_stream_receive(quicly_stream_t *stream, size_t off, const void *src, size_t len)
{
    quicly_conn_t *conn = stream->conn;
    size_t in_epoch = -(1 + stream->stream_id), epoch_offsets[5] = {0};
    ptls_iovec_t input;
    ptls_buffer_t output;

    if (quicly_streambuf_ingress_receive(stream, off, src, len) != 0)
        return;

    ptls_buffer_init(&output, "", 0);

    /* send handshake messages to picotls, and let it fill in the response */
    while ((input = quicly_streambuf_ingress_get(stream)).len != 0) {
        int handshake_result = ptls_handle_message(conn->crypto.tls, &output, epoch_offsets, in_epoch, input.base, input.len,
                                                   &conn->crypto.handshake_properties);
        quicly_streambuf_ingress_shift(stream, input.len);
        QUICLY_PROBE(CRYPTO_HANDSHAKE, conn, conn->stash.now, handshake_result);
        switch (handshake_result) {
        case 0:
        case PTLS_ERROR_IN_PROGRESS:
            break;
        default:
            initiate_close(conn,
                           PTLS_ERROR_GET_CLASS(handshake_result) == PTLS_ERROR_CLASS_SELF_ALERT ? handshake_result
                                                                                                 : QUICLY_TRANSPORT_ERROR_INTERNAL,
                           QUICLY_FRAME_TYPE_CRYPTO, NULL);
            goto Exit;
        }
        /* drop 0-RTT write key if 0-RTT is rejected by remote peer */
        if (conn->application != NULL && !conn->application->one_rtt_writable &&
            conn->application->cipher.egress.key.aead != NULL) {
            assert(quicly_is_client(conn));
            if (conn->crypto.handshake_properties.client.early_data_acceptance == PTLS_EARLY_DATA_REJECTED) {
                dispose_cipher(&conn->application->cipher.egress.key);
                conn->application->cipher.egress.key = (struct st_quicly_cipher_context_t){NULL};
                /* retire all packets with ack_epoch == 3; they are all 0-RTT packets */
                int ret;
                if ((ret = discard_sentmap_by_epoch(conn, 1u << QUICLY_EPOCH_1RTT)) != 0) {
                    initiate_close(conn, ret, QUICLY_FRAME_TYPE_CRYPTO, NULL);
                    goto Exit;
                }
            }
        }
    }
    write_crypto_data(conn, &output, epoch_offsets);

Exit:
    ptls_buffer_dispose(&output);
}